

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_collider.cpp
# Opt level: O3

void __thiscall
embree::avx2::BVHNColliderUserGeom<8>::processLeaf
          (BVHNColliderUserGeom<8> *this,NodeRef node0,NodeRef node1)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Collision collisions [16];
  RTCCollision local_138 [264];
  
  uVar3 = (ulong)((uint)node0.ptr & 0xf);
  if (uVar3 != 8) {
    uVar6 = (ulong)((uint)node1.ptr & 0xf);
    lVar4 = 0;
    lVar8 = 0;
    do {
      if (uVar6 != 8) {
        lVar7 = 0;
        lVar5 = lVar4;
        do {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = *(ulong *)((node0.ptr & 0xfffffffffffffff0) + lVar8 * 8);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = *(ulong *)((node1.ptr & 0xfffffffffffffff0) + lVar7 * 8);
          auVar1 = vpcmpeqd_avx(auVar9,auVar10);
          auVar1 = vpmovsxdq_avx(auVar1);
          uVar2 = vmovmskpd_avx(auVar1);
          if ((((uVar2 & 2) == 0) || ((uVar2 & 1) == 0)) ||
             (lVar4 = lVar5,
             (this->super_BVHNCollider<8>).scene0 != (this->super_BVHNCollider<8>).scene1)) {
            lVar4 = lVar5 + 1;
            auVar1 = vpunpcklqdq_avx(auVar9,auVar10);
            *(undefined1 (*) [16])(local_138 + lVar5 * 0x10) = auVar1;
            if (lVar4 == 0x10) {
              (*(this->super_BVHNCollider<8>).callback)
                        ((this->super_BVHNCollider<8>).userPtr,local_138,0x10);
              lVar4 = 0;
            }
          }
          lVar7 = lVar7 + 1;
          lVar5 = lVar4;
        } while (uVar6 - 8 != lVar7);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != uVar3 - 8);
    if (lVar4 != 0) {
      (*(this->super_BVHNCollider<8>).callback)
                ((this->super_BVHNCollider<8>).userPtr,local_138,(uint)lVar4);
    }
  }
  return;
}

Assistant:

__forceinline void BVHNColliderUserGeom<N>::processLeaf(NodeRef node0, NodeRef node1)
    {
      Collision collisions[16];
      size_t num_collisions = 0;

      size_t N0; Object* leaf0 = (Object*) node0.leaf(N0);
      size_t N1; Object* leaf1 = (Object*) node1.leaf(N1);
      for (size_t i=0; i<N0; i++) {
        for (size_t j=0; j<N1; j++) {
          const unsigned geomID0 = leaf0[i].geomID();
          const unsigned primID0 = leaf0[i].primID();
          const unsigned geomID1 = leaf1[j].geomID();
          const unsigned primID1 = leaf1[j].primID();
          if (this->scene0 == this->scene1 && geomID0 == geomID1 && primID0 == primID1) continue;
          collisions[num_collisions++] = Collision(geomID0,primID0,geomID1,primID1);
          if (num_collisions == 16) {
            this->callback(this->userPtr,(RTCCollision*)&collisions,num_collisions);
            num_collisions = 0;
          }
        }
      }
      if (num_collisions)
        this->callback(this->userPtr,(RTCCollision*)&collisions,num_collisions);
    }